

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

void __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::span_iterator
          (span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> *this,
          span<pstore::sat_entry,__1L> *span,index_type index)

{
  index_type iVar1;
  index_type index_local;
  span<pstore::sat_entry,__1L> *span_local;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> *this_local;
  
  this->span_ = span;
  this->index_ = index;
  if (span == (span<pstore::sat_entry,__1L> *)0x0) {
    return;
  }
  if ((-1 < this->index_) &&
     (iVar1 = span<pstore::sat_entry,_-1L>::length(this->span_), index <= iVar1)) {
    return;
  }
  assert_failed("span == nullptr || (index_ >= 0 && index <= span_->length ())",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x52);
}

Assistant:

constexpr span_iterator (Span const * span,
                                         typename Span::index_type index) noexcept
                        : span_ (span)
                        , index_ (index) {
                    PSTORE_ASSERT (span == nullptr || (index_ >= 0 && index <= span_->length ()));
                }